

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Clara::CommandLine<Catch::ConfigData>::Arg::~Arg(Arg *this)

{
  CommonArgProperties<Catch::ConfigData> *in_RDI;
  
  OptionArgProperties::~OptionArgProperties((OptionArgProperties *)in_RDI);
  CommonArgProperties<Catch::ConfigData>::~CommonArgProperties(in_RDI);
  return;
}

Assistant:

Arg() {}